

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O2

int fmt::v5::getpagesize(void)

{
  long lVar1;
  system_error *this;
  int *piVar2;
  string_view message;
  
  lVar1 = test::sysconf(0x1e);
  if (-1 < lVar1) {
    return (int)lVar1;
  }
  this = (system_error *)__cxa_allocate_exception(0x18);
  piVar2 = __errno_location();
  message.size_ = 0x1b;
  message.data_ = "cannot get memory page size";
  system_error::system_error<>(this,*piVar2,message);
  __cxa_throw(this,&system_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

long getpagesize() {
#ifdef _WIN32
  SYSTEM_INFO si;
  GetSystemInfo(&si);
  return si.dwPageSize;
#else
  long size = FMT_POSIX_CALL(sysconf(_SC_PAGESIZE));
  if (size < 0)
    FMT_THROW(system_error(errno, "cannot get memory page size"));
  return size;
#endif
}